

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O1

void iprog_set(OBJ_INDEX_DATA *obj,char *progtype,char *name)

{
  byte *pbVar1;
  IPROG_DATA *pIVar2;
  long lVar3;
  bool bVar4;
  char *pcVar5;
  long lVar6;
  improg_type *piVar7;
  string_view fmt;
  string_view fmt_00;
  
  bVar4 = str_cmp("get_prog_bad_idea",name);
  if (bVar4) {
    lVar3 = 0;
    do {
      lVar6 = lVar3;
      if (lVar6 + 0x20 == 0xa20) goto LAB_002e2492;
      pcVar5 = *(char **)((long)&iprog_table[1].name + lVar6);
      bVar4 = str_cmp(pcVar5,name);
      lVar3 = lVar6 + 0x20;
    } while (bVar4);
    bVar4 = pcVar5 == (char *)0x0;
    piVar7 = (improg_type *)((long)&iprog_table[1].type + lVar6);
  }
  else {
    piVar7 = iprog_table;
    bVar4 = false;
  }
  if (!bVar4) {
    bVar4 = str_cmp(progtype,"wear_prog");
    if (bVar4) {
      bVar4 = str_cmp(progtype,"remove_prog");
      if (bVar4) {
        bVar4 = str_cmp(progtype,"get_prog");
        if (bVar4) {
          bVar4 = str_cmp(progtype,"loot_prog");
          if (bVar4) {
            bVar4 = str_cmp(progtype,"drop_prog");
            if (bVar4) {
              bVar4 = str_cmp(progtype,"sac_prog");
              if (bVar4) {
                bVar4 = str_cmp(progtype,"entry_prog");
                if (bVar4) {
                  bVar4 = str_cmp(progtype,"give_prog");
                  if (bVar4) {
                    bVar4 = str_cmp(progtype,"greet_prog");
                    if (bVar4) {
                      bVar4 = str_cmp(progtype,"fight_prog");
                      if (bVar4) {
                        bVar4 = str_cmp(progtype,"death_prog");
                        if (bVar4) {
                          bVar4 = str_cmp(progtype,"speech_prog");
                          if (bVar4) {
                            bVar4 = str_cmp(progtype,"pulse_prog");
                            if (bVar4) {
                              bVar4 = str_cmp(progtype,"invoke_prog");
                              if (bVar4) {
                                bVar4 = str_cmp(progtype,"open_prog");
                                if (bVar4) {
                                  bVar4 = str_cmp(progtype,"look_prog");
                                  if (bVar4) {
                                    bVar4 = str_cmp(progtype,"verb_prog");
                                    if (!bVar4) {
                                      pIVar2 = obj->iprogs;
                                      pIVar2->verb_prog = (undefined1 *)piVar7->function;
                                      pcVar5 = pIVar2->verb_name;
                                      if (pcVar5 != (char *)0x0) {
                                        free_pstring(pcVar5);
                                      }
                                      pcVar5 = palloc_string(name);
                                      obj->iprogs->verb_name = pcVar5;
                                      pbVar1 = (byte *)((long)obj->progtypes + 1);
                                      *pbVar1 = *pbVar1 | 0x20;
                                      return;
                                    }
                                    bVar4 = str_cmp(progtype,"hit_prog");
                                    if (!bVar4) {
                                      pIVar2 = obj->iprogs;
                                      pIVar2->hit_prog = (IPROG_FUN_HIT *)piVar7->function;
                                      free_pstring(pIVar2->hit_name);
                                      pcVar5 = palloc_string(name);
                                      obj->iprogs->hit_name = pcVar5;
                                      pbVar1 = (byte *)((long)obj->progtypes + 2);
                                      *pbVar1 = *pbVar1 | 4;
                                      return;
                                    }
                                    fmt_00._M_str =
                                         "Load_improgs: \'I\': invalid program type for vnum {}";
                                    fmt_00._M_len = 0x33;
                                    CLogger::Error<short&>
                                              ((CLogger *)&RS.field_0x140,fmt_00,&obj->vnum);
                                    exit(1);
                                  }
                                  pIVar2 = obj->iprogs;
                                  pIVar2->look_prog = (undefined1 *)piVar7->function;
                                  pcVar5 = pIVar2->look_name;
                                  if (pcVar5 != (char *)0x0) {
                                    free_pstring(pcVar5);
                                  }
                                  pcVar5 = palloc_string(name);
                                  obj->iprogs->look_name = pcVar5;
                                }
                                else {
                                  pIVar2 = obj->iprogs;
                                  pIVar2->open_prog = (undefined1 *)piVar7->function;
                                  pcVar5 = pIVar2->open_name;
                                  if (pcVar5 != (char *)0x0) {
                                    free_pstring(pcVar5);
                                  }
                                  pcVar5 = palloc_string(name);
                                  obj->iprogs->open_name = pcVar5;
                                }
                                pbVar1 = (byte *)((long)obj->progtypes + 1);
                                *pbVar1 = *pbVar1 | 0x80;
                              }
                              else {
                                pIVar2 = obj->iprogs;
                                pIVar2->invoke_prog = (undefined1 *)piVar7->function;
                                pcVar5 = pIVar2->invoke_name;
                                if (pcVar5 != (char *)0x0) {
                                  free_pstring(pcVar5);
                                }
                                pcVar5 = palloc_string(name);
                                obj->iprogs->invoke_name = pcVar5;
                                pbVar1 = (byte *)((long)obj->progtypes + 1);
                                *pbVar1 = *pbVar1 | 0x10;
                              }
                            }
                            else {
                              pIVar2 = obj->iprogs;
                              pIVar2->pulse_prog = (IPROG_FUN_PULSE *)piVar7->function;
                              pcVar5 = pIVar2->pulse_name;
                              if (pcVar5 != (char *)0x0) {
                                free_pstring(pcVar5);
                              }
                              pcVar5 = palloc_string(name);
                              obj->iprogs->pulse_name = pcVar5;
                              pbVar1 = (byte *)((long)obj->progtypes + 1);
                              *pbVar1 = *pbVar1 | 8;
                            }
                          }
                          else {
                            pIVar2 = obj->iprogs;
                            pIVar2->speech_prog = (undefined1 *)piVar7->function;
                            pcVar5 = pIVar2->speech_name;
                            if (pcVar5 != (char *)0x0) {
                              free_pstring(pcVar5);
                            }
                            pcVar5 = palloc_string(name);
                            obj->iprogs->speech_name = pcVar5;
                            pbVar1 = (byte *)((long)obj->progtypes + 1);
                            *pbVar1 = *pbVar1 | 1;
                          }
                        }
                        else {
                          pIVar2 = obj->iprogs;
                          pIVar2->death_prog = (undefined1 *)piVar7->function;
                          pcVar5 = pIVar2->death_name;
                          if (pcVar5 != (char *)0x0) {
                            free_pstring(pcVar5);
                          }
                          pcVar5 = palloc_string(name);
                          obj->iprogs->death_name = pcVar5;
                          *(byte *)obj->progtypes = (byte)obj->progtypes[0] | 0x80;
                        }
                      }
                      else {
                        pIVar2 = obj->iprogs;
                        pIVar2->fight_prog = (undefined1 *)piVar7->function;
                        pcVar5 = pIVar2->fight_name;
                        if (pcVar5 != (char *)0x0) {
                          free_pstring(pcVar5);
                        }
                        pcVar5 = palloc_string(name);
                        obj->iprogs->fight_name = pcVar5;
                        *(byte *)obj->progtypes = (byte)obj->progtypes[0] | 0x40;
                      }
                    }
                    else {
                      pIVar2 = obj->iprogs;
                      pIVar2->greet_prog = (undefined1 *)piVar7->function;
                      pcVar5 = pIVar2->greet_name;
                      if (pcVar5 != (char *)0x0) {
                        free_pstring(pcVar5);
                      }
                      pcVar5 = palloc_string(name);
                      obj->iprogs->greet_name = pcVar5;
                      *(byte *)obj->progtypes = (byte)obj->progtypes[0] | 0x20;
                    }
                  }
                  else {
                    pIVar2 = obj->iprogs;
                    pIVar2->give_prog = (IPROG_FUN_GIVE *)piVar7->function;
                    pcVar5 = pIVar2->give_name;
                    if (pcVar5 != (char *)0x0) {
                      free_pstring(pcVar5);
                    }
                    pcVar5 = palloc_string(name);
                    obj->iprogs->give_name = pcVar5;
                    *(byte *)obj->progtypes = (byte)obj->progtypes[0] | 0x10;
                  }
                }
                else {
                  pIVar2 = obj->iprogs;
                  pIVar2->entry_prog = (IPROG_FUN_ENTRY *)piVar7->function;
                  pcVar5 = pIVar2->entry_name;
                  if (pcVar5 != (char *)0x0) {
                    free_pstring(pcVar5);
                  }
                  pcVar5 = palloc_string(name);
                  obj->iprogs->entry_name = pcVar5;
                  pbVar1 = (byte *)((long)obj->progtypes + 1);
                  *pbVar1 = *pbVar1 | 2;
                }
              }
              else {
                pIVar2 = obj->iprogs;
                pIVar2->sac_prog = (undefined1 *)piVar7->function;
                free_pstring(pIVar2->sac_name);
                pcVar5 = palloc_string(name);
                obj->iprogs->sac_name = pcVar5;
                *(byte *)obj->progtypes = (byte)obj->progtypes[0] | 8;
              }
            }
            else {
              pIVar2 = obj->iprogs;
              pIVar2->drop_prog = (undefined1 *)piVar7->function;
              pcVar5 = pIVar2->drop_name;
              if (pcVar5 != (char *)0x0) {
                free_pstring(pcVar5);
              }
              pcVar5 = palloc_string(name);
              obj->iprogs->drop_name = pcVar5;
              *(byte *)obj->progtypes = (byte)obj->progtypes[0] | 4;
            }
          }
          else {
            pIVar2 = obj->iprogs;
            pIVar2->loot_prog = (IPROG_FUN_LOOT *)piVar7->function;
            pcVar5 = pIVar2->loot_name;
            if (pcVar5 != (char *)0x0) {
              free_pstring(pcVar5);
            }
            pcVar5 = palloc_string(name);
            obj->iprogs->loot_name = pcVar5;
            pbVar1 = (byte *)((long)obj->progtypes + 1);
            *pbVar1 = *pbVar1 | 0x40;
          }
        }
        else {
          pIVar2 = obj->iprogs;
          pIVar2->get_prog = (undefined1 *)piVar7->function;
          pcVar5 = pIVar2->get_name;
          if (pcVar5 != (char *)0x0) {
            free_pstring(pcVar5);
          }
          pcVar5 = palloc_string(name);
          obj->iprogs->get_name = pcVar5;
          pbVar1 = (byte *)((long)obj->progtypes + 1);
          *pbVar1 = *pbVar1 | 4;
        }
      }
      else {
        pIVar2 = obj->iprogs;
        pIVar2->remove_prog = (undefined1 *)piVar7->function;
        pcVar5 = pIVar2->remove_name;
        if (pcVar5 != (char *)0x0) {
          free_pstring(pcVar5);
        }
        pcVar5 = palloc_string(name);
        obj->iprogs->remove_name = pcVar5;
        *(byte *)obj->progtypes = (byte)obj->progtypes[0] | 2;
      }
    }
    else {
      pIVar2 = obj->iprogs;
      pIVar2->wear_prog = (undefined1 *)piVar7->function;
      pcVar5 = pIVar2->wear_name;
      if (pcVar5 != (char *)0x0) {
        free_pstring(pcVar5);
      }
      pcVar5 = palloc_string(name);
      obj->iprogs->wear_name = pcVar5;
      *(byte *)obj->progtypes = (byte)obj->progtypes[0] | 1;
    }
    return;
  }
LAB_002e2492:
  fmt._M_str = "Load_improgs: \'I\': Function not found for vnum {}";
  fmt._M_len = 0x31;
  CLogger::Warn<short&>((CLogger *)&RS.field_0x140,fmt,&obj->vnum);
  return;
}

Assistant:

void iprog_set(OBJ_INDEX_DATA *obj, const char *progtype, const char *name)
{
	int i;
	for (i = 0; iprog_table[i].name != nullptr; i++)
	{
		if (!str_cmp(iprog_table[i].name, name))
			break;
	}

	if (!iprog_table[i].name)
	{
		RS.Logger.Warn("Load_improgs: 'I': Function not found for vnum {}", obj->vnum);
		return;
	}

	if (!str_cmp(progtype, "wear_prog"))
	{
		obj->iprogs->wear_prog = (IPROG_FUN_WEAR *)iprog_table[i].function;

		if (obj->iprogs->wear_name)
			free_pstring(obj->iprogs->wear_name);

		obj->iprogs->wear_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_WEAR);
		return;
	}

	if (!str_cmp(progtype, "remove_prog"))
	{
		obj->iprogs->remove_prog = (IPROG_FUN_REMOVE *)iprog_table[i].function;

		if (obj->iprogs->remove_name)
			free_pstring(obj->iprogs->remove_name);

		obj->iprogs->remove_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_REMOVE);
		return;
	}

	if (!str_cmp(progtype, "get_prog"))
	{
		obj->iprogs->get_prog = (IPROG_FUN_GET *)iprog_table[i].function;

		if (obj->iprogs->get_name)
			free_pstring(obj->iprogs->get_name);

		obj->iprogs->get_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_GET);
		return;
	}

	if (!str_cmp(progtype, "loot_prog")) /* Returning false prevents taking */
	{
		obj->iprogs->loot_prog = (IPROG_FUN_LOOT *)iprog_table[i].function;

		if (obj->iprogs->loot_name)
			free_pstring(obj->iprogs->loot_name);

		obj->iprogs->loot_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_LOOT);
		return;
	}

	if (!str_cmp(progtype, "drop_prog"))
	{
		obj->iprogs->drop_prog = (IPROG_FUN_DROP *)iprog_table[i].function;

		if (obj->iprogs->drop_name)
			free_pstring(obj->iprogs->drop_name);

		obj->iprogs->drop_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_DROP);
		return;
	}

	if (!str_cmp(progtype, "sac_prog"))
	{
		obj->iprogs->sac_prog = (IPROG_FUN_SAC *)iprog_table[i].function;
		free_pstring(obj->iprogs->sac_name);

		obj->iprogs->sac_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_SAC);
		return;
	}

	if (!str_cmp(progtype, "entry_prog"))
	{
		obj->iprogs->entry_prog = (IPROG_FUN_ENTRY *)iprog_table[i].function;

		if (obj->iprogs->entry_name)
			free_pstring(obj->iprogs->entry_name);

		obj->iprogs->entry_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_ENTRY);
		return;
	}

	if (!str_cmp(progtype, "give_prog"))
	{
		obj->iprogs->give_prog = (IPROG_FUN_GIVE *)iprog_table[i].function;

		if (obj->iprogs->give_name)
			free_pstring(obj->iprogs->give_name);

		obj->iprogs->give_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_GIVE);
		return;
	}

	if (!str_cmp(progtype, "greet_prog"))
	{
		obj->iprogs->greet_prog = (IPROG_FUN_GREET *)iprog_table[i].function;

		if (obj->iprogs->greet_name)
			free_pstring(obj->iprogs->greet_name);

		obj->iprogs->greet_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_GREET);
		return;
	}

	if (!str_cmp(progtype, "fight_prog"))
	{
		obj->iprogs->fight_prog = (IPROG_FUN_FIGHT *)iprog_table[i].function;

		if (obj->iprogs->fight_name)
			free_pstring(obj->iprogs->fight_name);

		obj->iprogs->fight_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_FIGHT);
		return;
	}

	if (!str_cmp(progtype, "death_prog")) /* returning true prevents death */
	{
		obj->iprogs->death_prog = (IPROG_FUN_DEATH *)iprog_table[i].function;

		if (obj->iprogs->death_name)
			free_pstring(obj->iprogs->death_name);

		obj->iprogs->death_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_DEATH);
		return;
	}

	if (!str_cmp(progtype, "speech_prog"))
	{
		obj->iprogs->speech_prog = (IPROG_FUN_SPEECH *)iprog_table[i].function;

		if (obj->iprogs->speech_name)
			free_pstring(obj->iprogs->speech_name);

		obj->iprogs->speech_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_SPEECH);
		return;
	}

	if (!str_cmp(progtype, "pulse_prog"))
	{
		obj->iprogs->pulse_prog = (IPROG_FUN_PULSE *)iprog_table[i].function;

		if (obj->iprogs->pulse_name)
			free_pstring(obj->iprogs->pulse_name);

		obj->iprogs->pulse_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_PULSE);
		return;
	}

	if (!str_cmp(progtype, "invoke_prog"))
	{
		obj->iprogs->invoke_prog = (IPROG_FUN_INVOKE *)iprog_table[i].function;
		if (obj->iprogs->invoke_name)
			free_pstring(obj->iprogs->invoke_name);
		obj->iprogs->invoke_name = palloc_string(name);
		SET_BIT(obj->progtypes, IPROG_INVOKE);
		return;
	}

	if (!str_cmp(progtype, "open_prog"))
	{
		obj->iprogs->open_prog = (IPROG_FUN_OPEN *)iprog_table[i].function;

		if (obj->iprogs->open_name)
			free_pstring(obj->iprogs->open_name);

		obj->iprogs->open_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_OPEN);
		return;
	}

	if (!str_cmp(progtype, "look_prog"))
	{
		obj->iprogs->look_prog = (IPROG_FUN_LOOK *)iprog_table[i].function;

		if (obj->iprogs->look_name)
			free_pstring(obj->iprogs->look_name);

		obj->iprogs->look_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_OPEN);
		return;
	}

	if (!str_cmp(progtype, "verb_prog"))
	{
		obj->iprogs->verb_prog = (IPROG_FUN_VERB *)iprog_table[i].function;

		if (obj->iprogs->verb_name)
			free_pstring(obj->iprogs->verb_name);

		obj->iprogs->verb_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_VERB);
		return;
	}

	if (!str_cmp(progtype, "hit_prog"))
	{
		obj->iprogs->hit_prog = (IPROG_FUN_HIT *)iprog_table[i].function;
		free_pstring(obj->iprogs->hit_name);

		obj->iprogs->hit_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_HIT);
		return;
	}

	RS.Logger.Error("Load_improgs: 'I': invalid program type for vnum {}", obj->vnum);
	exit(1);
}